

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O3

Extra_ImageTree_t *
Extra_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,
                   DdNode **pbVars,int fVerbose)

{
  size_t __size;
  DdHalfWord DVar1;
  void *pvVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  DdNode *bTemp;
  DdNode *pDVar6;
  DdNode *pDVar7;
  long lVar8;
  void *__ptr;
  undefined8 *puVar9;
  DdNode **F;
  ulong uVar10;
  DdNode *pDVar11;
  void *__ptr_00;
  DdHalfWord *pDVar12;
  void *__ptr_01;
  Extra_ImageTree_t *pEVar13;
  Extra_ImageNode_t *pEVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  DdNode *f;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  Extra_ImageNode_t *pNode2;
  DdHalfWord DVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  long local_88;
  long local_40;
  
  uVar15 = (ulong)(uint)nParts;
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar6 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar6);
    pDVar7 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar7);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",uVar15,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    if (0 < dd->size) {
      uVar17 = 0;
      do {
        printf("%d",(ulong)(uVar17 % 10));
        uVar17 = uVar17 + 1;
      } while ((int)uVar17 < dd->size);
    }
    putchar(10);
    if (0 < nParts) {
      uVar22 = 0;
      do {
        Extra_bddImagePrintLatchDependencyOne(dd,pbParts[uVar22],pDVar6,pDVar7,(int)uVar22);
        uVar22 = uVar22 + 1;
      } while (uVar15 != uVar22);
    }
    Extra_bddImagePrintLatchDependencyOne(dd,bCare,pDVar6,pDVar7,nParts);
    Cudd_RecursiveDeref(dd,pDVar6);
    Cudd_RecursiveDeref(dd,pDVar7);
  }
  lVar8 = (long)nParts;
  __size = lVar8 * 8 + 8;
  __ptr = malloc(__size);
  if (0 < nParts) {
    uVar22 = 0;
    do {
      puVar9 = (undefined8 *)malloc(0x18);
      *(undefined8 **)((long)__ptr + uVar22 * 8) = puVar9;
      pDVar6 = pbParts[uVar22];
      *puVar9 = pDVar6;
      Cudd_Ref(pDVar6);
      pDVar6 = Cudd_Support(dd,(DdNode *)*puVar9);
      puVar9[1] = pDVar6;
      Cudd_Ref(pDVar6);
      iVar5 = Extra_bddSuppSize(dd,(DdNode *)puVar9[1]);
      *(short *)((long)puVar9 + 0x14) = (short)iVar5;
      iVar5 = Cudd_DagSize((DdNode *)*puVar9);
      *(int *)(puVar9 + 2) = iVar5;
      *(short *)((long)puVar9 + 0x16) = (short)uVar22;
      uVar22 = uVar22 + 1;
    } while (uVar15 != uVar22);
  }
  puVar9 = (undefined8 *)malloc(0x18);
  *(undefined8 **)((long)__ptr + lVar8 * 8) = puVar9;
  *puVar9 = bCare;
  Cudd_Ref(bCare);
  pDVar6 = Cudd_Support(dd,(DdNode *)*puVar9);
  puVar9[1] = pDVar6;
  Cudd_Ref(pDVar6);
  iVar5 = Extra_bddSuppSize(dd,(DdNode *)puVar9[1]);
  *(short *)((long)puVar9 + 0x14) = (short)iVar5;
  iVar5 = Cudd_DagSize((DdNode *)*puVar9);
  *(int *)(puVar9 + 2) = iVar5;
  *(short *)((long)puVar9 + 0x16) = (short)nParts;
  F = (DdNode **)malloc(__size);
  uVar22 = (ulong)(nParts + 1U);
  if (-1 < nParts) {
    uVar10 = 0;
    do {
      F[uVar10] = *(DdNode **)(*(long *)((long)__ptr + uVar10 * 8) + 8);
      uVar10 = uVar10 + 1;
    } while (uVar22 != uVar10);
  }
  pDVar6 = Cudd_VectorSupport(dd,F,nParts + 1U);
  Cudd_Ref(pDVar6);
  if (F != (DdNode **)0x0) {
    free(F);
  }
  pDVar7 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar7);
  pDVar11 = Cudd_bddExistAbstract(dd,pDVar6,pDVar7);
  Cudd_Ref(pDVar11);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_RecursiveDeref(dd,pDVar7);
  Extra_bddSuppSize(dd,pDVar11);
  __ptr_00 = calloc(1,(long)dd->size << 3);
  pDVar7 = dd->one;
  pDVar6 = pDVar11;
  if (pDVar11 != pDVar7) {
    do {
      DVar1 = pDVar6->index;
      pDVar12 = (DdHalfWord *)malloc(0x18);
      *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar1 * 8) = pDVar12;
      *pDVar12 = DVar1;
      Cudd_Ref(pDVar7);
      if (nParts < 0) {
        DVar23 = 0;
      }
      else {
        uVar10 = 0;
        DVar23 = 0;
        f = pDVar7;
        do {
          iVar5 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar10 * 8) + 8),
                              dd->vars[pDVar6->index]);
          pDVar7 = f;
          if (iVar5 != 0) {
            pDVar7 = Cudd_bddAnd(dd,f,dd->vars[uVar10]);
            Cudd_Ref(pDVar7);
            Cudd_RecursiveDeref(dd,f);
            DVar23 = DVar23 + 1;
          }
          uVar10 = uVar10 + 1;
          f = pDVar7;
        } while (uVar22 != uVar10);
        pDVar12 = *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar1 * 8);
      }
      *(DdNode **)(pDVar12 + 2) = pDVar7;
      pDVar12[4] = DVar23;
      pDVar6 = (pDVar6->type).kids.T;
      pDVar7 = dd->one;
    } while (pDVar6 != pDVar7);
  }
  Cudd_RecursiveDeref(dd,pDVar11);
  uVar17 = dd->size;
  __ptr_01 = malloc(__size);
  if (-1 < nParts) {
    uVar10 = 0;
    do {
      puVar9 = (undefined8 *)calloc(1,0x30);
      *(undefined8 **)((long)__ptr_01 + uVar10 * 8) = puVar9;
      *puVar9 = dd;
      puVar9[5] = *(undefined8 *)((long)__ptr + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar22 != uVar10);
  }
  if (0 < (int)uVar17) {
    uVar10 = 0;
    do {
      pvVar2 = *(void **)((long)__ptr_00 + uVar10 * 8);
      if (pvVar2 != (void *)0x0) {
        if (*(int *)((long)pvVar2 + 0x10) < 1) {
          __assert_fail("pVars[v]->nParts > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                        ,0x1c0,
                        "Extra_ImageNode_t **Extra_CreateNodes(DdManager *, int, Extra_ImagePart_t **, int, Extra_ImageVar_t **)"
                       );
        }
        if (*(int *)((long)pvVar2 + 0x10) == 1) {
          lVar3 = *(long *)((long)__ptr_01 + (long)**(int **)((long)pvVar2 + 8) * 8);
          pDVar6 = *(DdNode **)(lVar3 + 8);
          pDVar7 = dd->vars[uVar10];
          if (pDVar6 == (DdNode *)0x0) {
            *(DdNode **)(lVar3 + 8) = pDVar7;
            Cudd_Ref(pDVar7);
          }
          else {
            pDVar7 = Cudd_bddAnd(dd,pDVar6,pDVar7);
            *(DdNode **)(lVar3 + 8) = pDVar7;
            Cudd_Ref(pDVar7);
            Cudd_RecursiveDeref(dd,pDVar6);
          }
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
          free(pvVar2);
          *(undefined8 *)((long)__ptr_00 + uVar10 * 8) = 0;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar17 != uVar10);
  }
  if (-1 < nParts) {
    uVar10 = 0;
    do {
      lVar3 = *(long *)((long)__ptr_01 + uVar10 * 8);
      puVar9 = *(undefined8 **)((long)__ptr + uVar10 * 8);
      if (*(DdNode **)(lVar3 + 8) != (DdNode *)0x0) {
        pDVar6 = (DdNode *)*puVar9;
        pDVar7 = Cudd_bddExistAbstract(dd,pDVar6,*(DdNode **)(lVar3 + 8));
        *puVar9 = pDVar7;
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar6 = (DdNode *)puVar9[1];
        pDVar7 = Cudd_bddExistAbstract(dd,pDVar6,*(DdNode **)(lVar3 + 8));
        puVar9[1] = pDVar7;
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,pDVar6);
        iVar5 = Extra_bddSuppSize(dd,(DdNode *)puVar9[1]);
        *(short *)((long)puVar9 + 0x14) = (short)iVar5;
        iVar5 = Cudd_DagSize((DdNode *)*puVar9);
        *(int *)(puVar9 + 2) = iVar5;
        if (uVar10 < uVar15) {
          Cudd_RecursiveDeref(dd,*(DdNode **)(lVar3 + 8));
          *(undefined8 *)(lVar3 + 8) = 0;
        }
      }
      pDVar6 = (DdNode *)*puVar9;
      *(DdNode **)(lVar3 + 0x10) = pDVar6;
      Cudd_Ref(pDVar6);
      uVar10 = uVar10 + 1;
    } while (uVar22 != uVar10);
  }
  pEVar13 = (Extra_ImageTree_t *)calloc(1,0x28);
  pEVar13->pCare = *(Extra_ImageNode_t **)((long)__ptr_01 + lVar8 * 8);
  pEVar13->fVerbose = fVerbose;
  uVar17 = dd->size;
  if (0 < (int)uVar17) {
LAB_008062c0:
    uVar15 = (ulong)uVar17;
    uVar24 = 0xffffffff;
    uVar10 = 0;
    dVar25 = 100000000000000.0;
    do {
      lVar8 = *(long *)((long)__ptr_00 + uVar10 * 8);
      if (lVar8 != 0) {
        dVar26 = 0.0;
        for (pDVar6 = *(DdNode **)(lVar8 + 8); pDVar6 != dd->one; pDVar6 = (pDVar6->type).kids.T) {
          iVar5 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar6->index * 8) + 0x28) +
                          0x10);
          dVar26 = dVar26 + (double)(iVar5 * iVar5);
        }
        if (dVar26 < dVar25) {
          uVar24 = uVar10 & 0xffffffff;
          dVar25 = dVar26;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar15);
    if ((int)uVar24 != -1) goto code_r0x0080632e;
    uVar10 = 0;
    do {
      if (*(long *)((long)__ptr_00 + uVar10 * 8) != 0) {
        __assert_fail("pVars[v] == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                      ,0xba,
                      "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                     );
      }
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
    goto LAB_008066ca;
  }
  if (__ptr_00 != (void *)0x0) {
LAB_008066ca:
    free(__ptr_00);
  }
  if (nParts < 0) {
LAB_00806828:
    __assert_fail("n1 != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                  ,0x2ef,
                  "Extra_ImageNode_t *Extra_MergeTopNodes(DdManager *, int, Extra_ImageNode_t **)");
  }
  iVar5 = -1;
  uVar15 = 0;
LAB_008066e6:
  do {
    iVar20 = iVar5;
    if ((*(long *)((long)__ptr_01 + uVar15 * 8) == 0) || (iVar20 = (int)uVar15, iVar5 == -1)) {
      iVar5 = iVar20;
      uVar15 = uVar15 + 1;
      if (uVar15 != uVar22) goto LAB_008066e6;
      if (iVar5 == -1) goto LAB_00806828;
      uVar15 = (ulong)iVar5;
      pEVar14 = *(Extra_ImageNode_t **)((long)__ptr_01 + uVar15 * 8);
    }
    else {
      uVar15 = uVar15 & 0xffffffff;
      pEVar14 = Extra_CombineTwoNodes
                          (dd,dd->one,*(Extra_ImageNode_t **)((long)__ptr_01 + (long)iVar5 * 8),
                           *(Extra_ImageNode_t **)((long)__ptr_01 + uVar15 * 8));
      *(Extra_ImageNode_t **)((long)__ptr_01 + (long)iVar5 * 8) = pEVar14;
      pEVar14 = (Extra_ImageNode_t *)0x0;
    }
    *(undefined8 *)(uVar15 * 8 + (long)__ptr_01) = 0;
    pEVar13->pRoot = pEVar14;
    uVar15 = 0;
    iVar5 = -1;
    if (pEVar14 != (Extra_ImageNode_t *)0x0) {
      uVar15 = 0;
      do {
        if (*(long *)((long)__ptr_01 + uVar15 * 8) != 0) {
          __assert_fail("pNodes[v] == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                        ,0xc2,
                        "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                       );
        }
        uVar15 = uVar15 + 1;
      } while (uVar22 != uVar15);
      free(__ptr_01);
      pDVar6 = Cudd_Support(dd,bCare);
      pEVar13->bCareSupp = pDVar6;
      Cudd_Ref(pDVar6);
      Extra_DeleteParts_rec(pEVar14);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return pEVar13;
    }
  } while( true );
code_r0x0080632e:
  lVar8 = (long)(int)uVar24;
  piVar4 = *(int **)((long)__ptr_00 + lVar8 * 8);
  iVar5 = Extra_bddSuppSize(dd,*(DdNode **)(piVar4 + 2));
  if (iVar5 != piVar4[4]) {
    __assert_fail("nSupp == pVar->nParts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                  ,0x286,
                  "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                 );
  }
  if (iVar5 == 2) {
    local_88 = (long)**(int **)(piVar4 + 2);
    local_40 = (long)**(int **)(*(int **)(piVar4 + 2) + 4);
    pEVar14 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_88 * 8);
    pNode2 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_40 * 8);
    pDVar6 = dd->vars[*piVar4];
    Cudd_Ref(pDVar6);
    uVar10 = 0;
    do {
      pDVar7 = pDVar6;
      if (((uVar24 != uVar10) &&
          (piVar4 = *(int **)((long)__ptr_00 + uVar10 * 8), piVar4 != (int *)0x0)) &&
         (*(long *)(piVar4 + 2) == *(long *)(*(long *)((long)__ptr_00 + lVar8 * 8) + 8))) {
        pDVar7 = Cudd_bddAnd(dd,pDVar6,dd->vars[*piVar4]);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(dd,pDVar6);
        pvVar2 = *(void **)((long)__ptr_00 + uVar10 * 8);
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
        free(pvVar2);
        *(undefined8 *)((long)__ptr_00 + uVar10 * 8) = 0;
      }
      uVar10 = uVar10 + 1;
      pDVar6 = pDVar7;
    } while (uVar15 != uVar10);
    pvVar2 = *(void **)((long)__ptr_00 + lVar8 * 8);
    Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
    free(pvVar2);
    *(undefined8 *)((long)__ptr_00 + lVar8 * 8) = 0;
    pEVar14 = Extra_CombineTwoNodes(dd,pDVar7,pEVar14,pNode2);
    Cudd_RecursiveDeref(dd,pDVar7);
  }
  else {
    if (iVar5 == 1) {
      __assert_fail("nSupp != 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                    ,0x287,
                    "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                   );
    }
    pDVar6 = *(DdNode **)(piVar4 + 2);
    if (dd->one == pDVar6) {
      local_88 = -1;
      local_40 = -1;
    }
    else {
      uVar10 = 0xffffffff;
      uVar24 = 0xffffffff;
      iVar5 = 1000000;
      iVar20 = 1000000;
      do {
        uVar17 = pDVar6->index;
        uVar19 = (ulong)uVar17;
        iVar21 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + uVar19 * 8) + 0x28) + 0x10);
        uVar16 = uVar24;
        iVar18 = iVar5;
        if (iVar5 <= iVar21) {
          if (iVar21 < iVar20) {
            uVar10 = uVar19;
          }
          iVar18 = iVar21;
          if (iVar20 < iVar21) {
            iVar18 = iVar20;
          }
          uVar17 = (uint)uVar24;
          uVar16 = uVar10;
          uVar19 = uVar24;
          iVar21 = iVar5;
        }
        pDVar6 = (pDVar6->type).kids.T;
        uVar10 = uVar16;
        uVar24 = uVar19;
        iVar5 = iVar21;
        iVar20 = iVar18;
      } while (pDVar6 != dd->one);
      local_88 = (long)(int)uVar17;
      local_40 = (long)(int)uVar16;
    }
    pEVar14 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_88 * 8);
    pNode2 = *(Extra_ImageNode_t **)((long)__ptr_01 + local_40 * 8);
    pDVar6 = Cudd_bddAnd(dd,dd->vars[local_88],dd->vars[local_40]);
    Cudd_Ref(pDVar6);
    uVar10 = 0;
    do {
      lVar8 = *(long *)((long)__ptr_00 + uVar10 * 8);
      if ((lVar8 != 0) && (*(DdNode **)(lVar8 + 8) == pDVar6)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                      ,0x2b3,
                      "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                     );
      }
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
    Cudd_RecursiveDeref(dd,pDVar6);
    pEVar14 = Extra_CombineTwoNodes(dd,dd->one,pEVar14,pNode2);
  }
  *(Extra_ImageNode_t **)((long)__ptr_01 + local_88 * 8) = pEVar14;
  *(undefined8 *)((long)__ptr_01 + local_40 * 8) = 0;
  pDVar6 = pNode2->pPart->bSupp;
  pDVar7 = dd->one;
  if (pDVar6 != pDVar7) {
    do {
      lVar8 = *(long *)((long)__ptr_00 + (ulong)pDVar6->index * 8);
      if (lVar8 != 0) {
        iVar5 = Cudd_bddLeq(dd,*(DdNode **)(lVar8 + 8),dd->vars[local_40]);
        if (iVar5 == 0) {
          __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddImage.c"
                        ,0x2c5,
                        "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                       );
        }
        pDVar7 = *(DdNode **)(lVar8 + 8);
        pDVar11 = Cudd_bddExistAbstract(dd,pDVar7,dd->vars[local_40]);
        *(DdNode **)(lVar8 + 8) = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar7);
        pDVar7 = *(DdNode **)(lVar8 + 8);
        pDVar11 = Cudd_bddAnd(dd,pDVar7,dd->vars[local_88]);
        *(DdNode **)(lVar8 + 8) = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar7);
        iVar5 = Extra_bddSuppSize(dd,*(DdNode **)(lVar8 + 8));
        *(int *)(lVar8 + 0x10) = iVar5;
        pDVar7 = dd->one;
      }
      pDVar6 = (pDVar6->type).kids.T;
    } while (pDVar6 != pDVar7);
  }
  uVar17 = dd->size;
  if ((int)uVar17 < 1) goto LAB_008066ca;
  goto LAB_008062c0;
}

Assistant:

Extra_ImageTree_t * Extra_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Extra_ImageTree_t * pTree;
    Extra_ImagePart_t ** pParts;
    Extra_ImageVar_t ** pVars;
    Extra_ImageNode_t ** pNodes;
    int v;

    if ( fVerbose && dd->size <= 80 )
        Extra_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Extra_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Extra_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Extra_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Extra_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Extra_ImageTree_t) );
    pTree->pCare = pNodes[nParts];
    pTree->fVerbose = fVerbose;

    // process the nodes
    while ( Extra_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars ) );

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );

    // merge the topmost nodes
    while ( (pTree->pRoot = Extra_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Extra_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Extra_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );
    return pTree;
}